

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

undefined8 duckdb::MillenniumFun::GetFunctions(void)

{
  undefined8 in_RDI;
  
  GetDatePartFunction<duckdb::DatePart::MillenniumOperator>();
  return in_RDI;
}

Assistant:

ScalarFunctionSet MillenniumFun::GetFunctions() {
	return GetDatePartFunction<DatePart::MillenniumOperator>();
}